

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<duckdb::date_t,_long> *state,date_t *x,long *y,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>>
              (state,(date_t)x->days,*y,binary);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_0049769e;
  }
  (state->arg).days = x->days;
LAB_0049769e:
  state->value = *y;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}